

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O2

void __thiscall FxConstant::FxConstant(FxConstant *this,ExpVal *cv,FScriptPosition *pos)

{
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00707480;
  (this->value).Type = (PType *)TypeSInt32;
  (this->value).field_1.Int = 0;
  ExpVal::operator=(&this->value,cv);
  (this->super_FxExpression).ValueType = cv->Type;
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(ExpVal cv, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		value = cv;
		ValueType = cv.Type;
		isresolved = true;
	}